

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

void eia608_dump(uint16_t cc_data)

{
  uint16_t uVar1;
  eia608_control_t eVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  int chan;
  char char2 [5];
  char char1 [5];
  int row;
  int underline;
  int col;
  eia608_style_t style;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  uint local_50;
  char local_4a [5];
  char local_45 [5];
  uint local_40;
  int local_3c;
  uint local_38;
  eia608_style_t local_34;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_4a[0] = '\0';
  local_45[0] = '\0';
  uVar1 = eia608_parity_word(cc_data);
  uVar4 = (uint)cc_data;
  uVar5 = uVar4 & 0x7f7f;
  if (uVar1 == cc_data) {
    if ((short)uVar5 == 0) {
      pcVar3 = "pad";
      uVar5 = 0;
    }
    else if ((cc_data & 0x6000) == 0) {
      if ((cc_data & 6000) == 0x1130) {
        eia608_to_utf8(cc_data,(int *)&local_50,local_45,local_4a);
        pcVar3 = "specialna";
      }
      else if ((cc_data & 0x1660) == 0x1220) {
        eia608_to_utf8(cc_data,(int *)&local_50,local_45,local_4a);
        pcVar3 = "westeu";
      }
      else if ((cc_data & 0x1070) == 0 && (cc_data & 0xf0f) != 0) {
        pcVar3 = "xds";
      }
      else if ((cc_data & 6000) == 0x1120) {
        pcVar3 = "midrowchange";
      }
      else {
        pcVar3 = "norpak";
        if (((short)(uVar4 & 0x177c) != 0x1724) && ((uVar4 & 0x177c) != 0x1728)) {
          if ((~uVar4 & 0x1040) == 0) {
            eia608_parse_preamble
                      (cc_data,(int *)&local_40,(int *)&local_38,&local_34,(int *)&local_50,
                       &local_3c);
            fprintf(_stderr,"preamble %d %d %d %d %d\n",(ulong)local_40,(ulong)local_38,
                    (ulong)local_34,(ulong)local_50,CONCAT44(uVar6,local_3c));
            pcVar3 = "preamble";
          }
          else if ((cc_data & 0x1670) == 0x1420 || (cc_data & 6000) == 0x1720) {
            eVar2 = eia608_parse_control(cc_data,(int *)&local_50);
            pcVar3 = "unknown_control";
            switch(eVar2) {
            case eia608_control_resume_caption_loading:
              pcVar3 = "eia608_control_resume_caption_loading";
              break;
            case eia608_control_backspace:
              pcVar3 = "eia608_control_backspace";
              break;
            case eia608_control_alarm_off:
              pcVar3 = "eia608_control_alarm_off";
              break;
            case eia608_control_alarm_on:
              pcVar3 = "eia608_control_alarm_on";
              break;
            case eia608_control_delete_to_end_of_row:
              pcVar3 = "eia608_control_delete_to_end_of_row";
              break;
            case eia608_control_roll_up_2:
              pcVar3 = "eia608_control_roll_up_2";
              break;
            case eia608_control_roll_up_3:
              pcVar3 = "eia608_control_roll_up_3";
              break;
            case eia608_control_roll_up_4:
              pcVar3 = "eia608_control_roll_up_4";
              break;
            case 0x1428:
              break;
            case eia608_control_resume_direct_captioning:
              pcVar3 = "eia608_control_resume_direct_captioning";
              break;
            case eia608_control_text_restart:
              pcVar3 = "eia608_control_text_restart";
              break;
            case eia608_control_text_resume_text_display:
              pcVar3 = "eia608_control_text_resume_text_display";
              break;
            case eia608_control_erase_display_memory:
              pcVar3 = "eia608_control_erase_display_memory";
              break;
            case eia608_control_carriage_return:
              pcVar3 = "eia608_control_carriage_return";
              break;
            case eia608_control_erase_non_displayed_memory:
              pcVar3 = "eia608_control_erase_non_displayed_memory";
              break;
            case eia608_control_end_of_caption:
              pcVar3 = "eia608_control_end_of_caption";
              break;
            default:
              switch(eVar2) {
              case eia608_tab_offset_0:
                pcVar3 = "eia608_tab_offset_0";
                break;
              case eia608_tab_offset_1:
                pcVar3 = "eia608_tab_offset_1";
                break;
              case eia608_tab_offset_2:
                pcVar3 = "eia608_tab_offset_2";
                break;
              case eia608_tab_offset_3:
                pcVar3 = "eia608_tab_offset_3";
              }
            }
          }
          else {
            pcVar3 = "unhandled";
          }
        }
      }
    }
    else {
      eia608_to_utf8(cc_data,(int *)&local_50,local_45,local_4a);
      pcVar3 = "basicna";
    }
  }
  else {
    pcVar3 = "parity failed";
  }
  fprintf(_stderr,"cc %04X (%04X) \'%s\' \'%s\' (%s)\n",cc_data,(ulong)uVar5,local_45,local_4a,
          pcVar3);
  return;
}

Assistant:

void eia608_dump(uint16_t cc_data)
{
    eia608_style_t style;
    const char* text = 0;
    char char1[5], char2[5];
    char1[0] = char2[0] = 0;
    int row, col, chan, underline;

    if (!eia608_parity_varify(cc_data)) {
        text = "parity failed";
    } else if (0 == eia608_parity_strip(cc_data)) {
        text = "pad";
    } else if (eia608_is_basicna(cc_data)) {
        text = "basicna";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_specialna(cc_data)) {
        text = "specialna";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_westeu(cc_data)) {
        text = "westeu";
        eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);
    } else if (eia608_is_xds(cc_data)) {
        text = "xds";
    } else if (eia608_is_midrowchange(cc_data)) {
        text = "midrowchange";
    } else if (eia608_is_norpak(cc_data)) {
        text = "norpak";
    } else if (eia608_is_preamble(cc_data)) {
        text = "preamble";
        eia608_parse_preamble(cc_data, &row, &col, &style, &chan, &underline);
        fprintf(stderr, "preamble %d %d %d %d %d\n", row, col, style, chan, underline);

    } else if (eia608_is_control(cc_data)) {
        switch (eia608_parse_control(cc_data, &chan)) {

        default:
            text = "unknown_control";
            break;

        case eia608_tab_offset_0:
            text = "eia608_tab_offset_0";
            break;

        case eia608_tab_offset_1:
            text = "eia608_tab_offset_1";
            break;

        case eia608_tab_offset_2:
            text = "eia608_tab_offset_2";
            break;

        case eia608_tab_offset_3:
            text = "eia608_tab_offset_3";
            break;

        case eia608_control_resume_caption_loading:
            text = "eia608_control_resume_caption_loading";
            break;

        case eia608_control_backspace:
            text = "eia608_control_backspace";
            break;

        case eia608_control_alarm_off:
            text = "eia608_control_alarm_off";
            break;

        case eia608_control_alarm_on:
            text = "eia608_control_alarm_on";
            break;

        case eia608_control_delete_to_end_of_row:
            text = "eia608_control_delete_to_end_of_row";
            break;

        case eia608_control_roll_up_2:
            text = "eia608_control_roll_up_2";
            break;

        case eia608_control_roll_up_3:
            text = "eia608_control_roll_up_3";
            break;

        case eia608_control_roll_up_4:
            text = "eia608_control_roll_up_4";
            break;

        case eia608_control_resume_direct_captioning:
            text = "eia608_control_resume_direct_captioning";
            break;

        case eia608_control_text_restart:
            text = "eia608_control_text_restart";
            break;

        case eia608_control_text_resume_text_display:
            text = "eia608_control_text_resume_text_display";
            break;

        case eia608_control_erase_display_memory:
            text = "eia608_control_erase_display_memory";
            break;

        case eia608_control_carriage_return:
            text = "eia608_control_carriage_return";
            break;

        case eia608_control_erase_non_displayed_memory:
            text = "eia608_control_erase_non_displayed_memory";
            break;

        case eia608_control_end_of_caption:
            text = "eia608_control_end_of_caption";
            break;
        }
    } else {
        text = "unhandled";
    }

    fprintf(stderr, "cc %04X (%04X) '%s' '%s' (%s)\n", cc_data, eia608_parity_strip(cc_data), char1, char2, text);
}